

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

Mat4 * __thiscall
vkt::sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,13>
          (Mat4 *__return_storage_ptr__,MatrixCaseUtils *this,ShaderEvalContext *evalCtx,
          int inputNdx)

{
  undefined8 uVar1;
  
  tcu::Matrix<float,_4,_4>::Matrix(__return_storage_ptr__);
  uVar1 = *(undefined8 *)(this + 0x38);
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[0].m_data = *(undefined8 *)(this + 0x30);
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[0].m_data + 2) = uVar1;
  uVar1 = *(undefined8 *)(this + 0x48);
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[1].m_data = *(undefined8 *)(this + 0x40);
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[1].m_data + 2) = uVar1;
  uVar1 = *(undefined8 *)(this + 0x58);
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[2].m_data = *(undefined8 *)(this + 0x50);
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[2].m_data + 2) = uVar1;
  uVar1 = *(undefined8 *)(this + 0x68);
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[3].m_data = *(undefined8 *)(this + 0x60);
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[3].m_data + 2) = uVar1;
  return __return_storage_ptr__;
}

Assistant:

inline tcu::Mat4 getInputValue<INPUTTYPE_DYNAMIC, TYPE_FLOAT_MAT4> (const ShaderEvalContext& evalCtx, int inputNdx)
{
	DE_UNREF(inputNdx); // Not used.
	tcu::Mat4 m;
	m.setColumn(0, evalCtx.in[0]);
	m.setColumn(1, evalCtx.in[1]);
	m.setColumn(2, evalCtx.in[2]);
	m.setColumn(3, evalCtx.in[3]);
	return m;
}